

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O3

Matrix33 *
AML::eulerAngleRatesMatrix_ZXY(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  undefined8 local_30;
  double local_28;
  double dStack_20;
  undefined8 local_18;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = sin(theta);
  dStack_20 = 1.0 / dVar3;
  local_38 = -dVar2 * dVar3 * dStack_20;
  local_58 = dVar4 * dVar2 * dStack_20;
  dStack_50 = dVar4 * dVar1 * dStack_20;
  local_48 = dVar3 * dStack_20;
  dStack_40 = dVar1 * dVar3 * dStack_20;
  local_30 = 0;
  local_28 = dStack_20 * dVar2;
  dStack_20 = dStack_20 * dVar1;
  local_18 = 0;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngleRatesMatrix_ZXY(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double secTheta = 1.0 / cosTheta;

        double data[3][3] = { { sinPhi * sinTheta * secTheta, cosPhi * sinTheta * secTheta, cosTheta * secTheta },
                              { cosTheta * cosPhi * secTheta, -sinPhi * cosTheta * secTheta, 0.0 },
                              { sinPhi * secTheta, cosPhi * secTheta, 0.0 } };

        return Matrix33(data);
    }